

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

qsizetype lastIndexof_helper<QStringView>
                    (QStringList *that,QStringView needle,qsizetype from,CaseSensitivity cs)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qsizetype *pqVar4;
  long lVar5;
  QStringView rhs;
  
  lVar1 = (that->d).size;
  lVar5 = lVar1 + -1;
  if (from < lVar1) {
    lVar5 = from;
  }
  if (from < 0) {
    lVar5 = lVar1 + from;
  }
  if (-1 < lVar5) {
    pqVar4 = &(that->d).ptr[lVar5].d.size;
    do {
      rhs.m_data = (char16_t *)pqVar4[-1];
      rhs.m_size = *pqVar4;
      iVar3 = QtPrivate::compareStrings(needle,rhs,cs);
      if (iVar3 == 0) {
        return lVar5;
      }
      pqVar4 = pqVar4 + -3;
      bVar2 = 0 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
  }
  return -1;
}

Assistant:

qsizetype lastIndexof_helper(const QStringList &that, String needle, qsizetype from,
                             Qt::CaseSensitivity cs)
{
    if (from < 0)
        from += that.size();
    else if (from >= that.size())
        from = that.size() - 1;

     for (qsizetype i = from; i >= 0; --i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }

    return -1;
}